

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_upper_bounds.cpp
# Opt level: O0

void __thiscall
despot::MDPUpperBound::MDPUpperBound(MDPUpperBound *this,MDP *model,StateIndexer *indexer)

{
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *__x;
  StateIndexer *indexer_local;
  MDP *model_local;
  MDPUpperBound *this_local;
  
  ParticleUpperBound::ParticleUpperBound(&this->super_ParticleUpperBound);
  BeliefUpperBound::BeliefUpperBound(&this->super_BeliefUpperBound);
  (this->super_ParticleUpperBound).super_ScenarioUpperBound._vptr_ScenarioUpperBound =
       (_func_int **)&PTR__MDPUpperBound_0026e570;
  (this->super_BeliefUpperBound)._vptr_BeliefUpperBound = (_func_int **)&PTR__MDPUpperBound_0026e5b0
  ;
  this->model_ = model;
  this->indexer_ = indexer;
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector(&this->policy_);
  (*this->model_->_vptr_MDP[6])();
  __x = MDP::policy(this->model_);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator=
            (&this->policy_,__x);
  return;
}

Assistant:

MDPUpperBound::MDPUpperBound(const MDP* model,
	const StateIndexer& indexer) :
	model_(model),
	indexer_(indexer) {
	const_cast<MDP*>(model_)->ComputeOptimalPolicyUsingVI();
	policy_ = model_->policy();
}